

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O2

string * __thiscall
libtorrent::aux::escape_file_path_abi_cxx11_
          (string *__return_storage_ptr__,aux *this,file_storage *storage,file_index_t index)

{
  string *save_path;
  string_view str;
  string new_path;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_59);
  save_path = &local_38;
  file_storage::file_path(&local_58,(file_storage *)this,(file_index_t)(int)storage,save_path);
  ::std::__cxx11::string::~string((string *)&local_38);
  str._M_str = (char *)save_path;
  str._M_len = (size_t)local_58._M_dataplus._M_p;
  escape_path_abi_cxx11_(__return_storage_ptr__,(libtorrent *)local_58._M_string_length,str);
  ::std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string escape_file_path(file_storage const& storage, file_index_t index)
{
	std::string new_path { storage.file_path(index) };
#ifdef TORRENT_WINDOWS
	convert_path_to_posix(new_path);
#endif
	return escape_path(new_path);
}